

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
::clear(Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
        *this,ID_index rowIndex)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  void *pvVar4;
  node_ptr plVar5;
  node_ptr plVar6;
  node_ptr next;
  iterator __position;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  *entry;
  key_type local_20;
  
  local_20 = (key_type)operator_new(0x20);
  (local_20->super_Entry_column_index_option).columnIndex_ = 0xffffffff;
  *(undefined8 *)&local_20->super_Entry_field_element_option = 0;
  *(undefined8 *)
   ((long)&(local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ + 4) = 0;
  *(undefined4 *)
   ((long)&(local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ + 4) = 0;
  local_20->rowIndex_ = rowIndex;
  __position = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>_>
               ::find(&(this->column_)._M_t,&local_20);
  if ((_Rb_tree_header *)__position._M_node != &(this->column_)._M_t._M_impl.super__Rb_tree_header)
  {
    if ((this->super_Row_access_option).rows_ != (Row_container *)0x0) {
      lVar1 = *(long *)(__position._M_node + 1);
      lVar2 = *(long *)(lVar1 + 8);
      if (lVar2 != 0) {
        plVar3 = *(long **)(lVar1 + 0x10);
        *plVar3 = lVar2;
        *(long **)(lVar2 + 8) = plVar3;
        *(undefined8 *)(lVar1 + 8) = 0;
        *(undefined8 *)(lVar1 + 0x10) = 0;
      }
    }
    pvVar4 = *(void **)(__position._M_node + 1);
    if (pvVar4 != (void *)0x0) {
      lVar1 = *(long *)((long)pvVar4 + 8);
      if (lVar1 != 0) {
        plVar3 = *(long **)((long)pvVar4 + 0x10);
        *plVar3 = lVar1;
        *(long **)(lVar1 + 8) = plVar3;
        *(undefined8 *)((long)pvVar4 + 8) = 0;
        *(undefined8 *)((long)pvVar4 + 0x10) = 0;
      }
      operator_delete(pvVar4,0x20);
    }
    std::
    _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>>
    ::erase_abi_cxx11_((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>>
                        *)&this->column_,(const_iterator)__position._M_node);
  }
  if (local_20 != (key_type)0x0) {
    plVar5 = (local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (plVar5 != (node_ptr)0x0) {
      plVar6 = (local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar6->next_ = plVar5;
      plVar5->prev_ = plVar6;
      (local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
      ;
      (local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
      ;
    }
    operator_delete(local_20,0x20);
  }
  return;
}

Assistant:

inline void Set_column<Master_matrix>::clear(ID_index rowIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  auto entry = entryPool_->construct(rowIndex);
  auto it = column_.find(entry);
  if (it != column_.end()) {
    _delete_entry(it);
  }
  entryPool_->destroy(entry);
}